

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::CopyResourceLayout
               (PipelineResourceLayoutDesc *SrcLayout,PipelineResourceLayoutDesc *DstLayout,
               FixedLinearAllocator *MemPool)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  ShaderResourceVariableDesc *pSVar4;
  undefined8 uVar5;
  ImmutableSamplerDesc *pIVar6;
  ShaderResourceVariableDesc *pSVar7;
  Char *pCVar8;
  ImmutableSamplerDesc *Args_10;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  size_t size;
  long lVar14;
  byte bVar15;
  ImmutableSamplerDesc *pIVar16;
  string _msg;
  
  bVar15 = 0;
  if (SrcLayout->Variables != (ShaderResourceVariableDesc *)0x0) {
    uVar3 = SrcLayout->NumVariables;
    size = (ulong)uVar3 << 4;
    pSVar7 = (ShaderResourceVariableDesc *)FixedLinearAllocator::Allocate(MemPool,size,8);
    if ((ulong)uVar3 != 0) {
      sVar9 = 0;
      do {
        *(undefined8 *)((long)&pSVar7->Name + sVar9 + 6) = 0;
        *(undefined8 *)((long)&pSVar7->Name + sVar9) = 0;
        sVar9 = sVar9 + 0x10;
      } while (size != sVar9);
    }
    DstLayout->Variables = pSVar7;
    if (SrcLayout->NumVariables != 0) {
      lVar14 = 0;
      uVar11 = 0;
      do {
        pSVar4 = SrcLayout->Variables;
        uVar5 = *(undefined8 *)((long)&pSVar4->Name + lVar14);
        *(undefined8 *)((long)&pSVar7->Name + lVar14 + 6) =
             *(undefined8 *)((long)&pSVar4->Name + lVar14 + 6);
        *(undefined8 *)((long)&pSVar7->Name + lVar14) = uVar5;
        pCVar8 = FixedLinearAllocator::CopyString
                           (MemPool,*(char **)((long)&pSVar4->Name + lVar14),0);
        *(Char **)((long)&pSVar7->Name + lVar14) = pCVar8;
        uVar11 = uVar11 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar11 < SrcLayout->NumVariables);
    }
  }
  if (SrcLayout->ImmutableSamplers != (ImmutableSamplerDesc *)0x0) {
    Args_10 = FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                        (MemPool,(ulong)SrcLayout->NumImmutableSamplers);
    DstLayout->ImmutableSamplers = Args_10;
    if (SrcLayout->NumImmutableSamplers != 0) {
      lVar14 = 0x38;
      uVar11 = 0;
      do {
        pIVar6 = SrcLayout->ImmutableSamplers;
        fVar1 = *(float *)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x38);
        if ((((((fVar1 != 0.0) || (NAN(fVar1))) ||
              (fVar2 = *(float *)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x34), fVar2 != 0.0))
             || (NAN(fVar2))) ||
            ((((fVar2 = *(float *)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x30), fVar2 != 0.0
               || (NAN(fVar2))) ||
              ((fVar2 = *(float *)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x2c), fVar2 != 0.0
               || (NAN(fVar2))))) &&
             (((fVar2 = *(float *)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x30), fVar2 != 0.0
               || (NAN(fVar2))) ||
              ((fVar2 = *(float *)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x2c), fVar2 != 1.0
               || (NAN(fVar2))))))))) &&
           ((((fVar1 != 1.0 || (NAN(fVar1))) ||
             (fVar1 = *(float *)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x34), fVar1 != 1.0))
            || (((NAN(fVar1) ||
                 (fVar1 = *(float *)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x30),
                 fVar1 != 1.0)) ||
                ((NAN(fVar1) ||
                 ((fVar1 = *(float *)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x2c),
                  fVar1 != 1.0 || (NAN(fVar1))))))))))) {
          FormatString<char[33],char_const*,char[27],float,char[3],float,char[3],float,char[3],float,char[131]>
                    (&_msg,(Diligent *)"Immutable sampler for variable \"",
                     (char (*) [33])((long)(pIVar6->Desc).BorderColor + lVar14 + -0x5c),
                     (char **)"\" specifies border color (",
                     (char (*) [27])((long)(pIVar6->Desc).BorderColor + lVar14 + -0x38),
                     (float *)0x3663e1,
                     (char (*) [3])((long)(pIVar6->Desc).BorderColor + lVar14 + -0x34),
                     (float *)0x3663e1,
                     (char (*) [3])((long)(pIVar6->Desc).BorderColor + lVar14 + -0x30),
                     (float *)0x3663e1,
                     (char (*) [3])((long)(pIVar6->Desc).BorderColor + lVar14 + -0x2c),
                     (float *)
                     "). D3D12 static samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors"
                     ,(char (*) [131])Args_10);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_msg._M_dataplus._M_p != &_msg.field_2) {
            operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
          }
        }
        puVar12 = (undefined8 *)((long)(pIVar6->Desc).BorderColor + lVar14 + -100);
        puVar13 = (undefined8 *)((long)(Args_10->Desc).BorderColor + lVar14 + -100);
        for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar13 = *puVar12;
          puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
          puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
        }
        pIVar16 = Args_10;
        pCVar8 = FixedLinearAllocator::CopyString
                           (MemPool,*(char **)((long)(pIVar6->Desc).BorderColor + lVar14 + -0x5c),0)
        ;
        *(Char **)((long)(Args_10->Desc).BorderColor + lVar14 + -0x5c) = pCVar8;
        uVar11 = uVar11 + 1;
        lVar14 = lVar14 + 0x48;
        Args_10 = pIVar16;
      } while (uVar11 < SrcLayout->NumImmutableSamplers);
    }
  }
  return;
}

Assistant:

static void CopyResourceLayout(const PipelineResourceLayoutDesc& SrcLayout, PipelineResourceLayoutDesc& DstLayout, FixedLinearAllocator& MemPool)
    {
        if (SrcLayout.Variables != nullptr)
        {
            ShaderResourceVariableDesc* const Variables = MemPool.ConstructArray<ShaderResourceVariableDesc>(SrcLayout.NumVariables);
            DstLayout.Variables                         = Variables;
            for (Uint32 i = 0; i < SrcLayout.NumVariables; ++i)
            {
                const ShaderResourceVariableDesc& SrcVar{SrcLayout.Variables[i]};
                Variables[i]      = SrcVar;
                Variables[i].Name = MemPool.CopyString(SrcVar.Name);
            }
        }

        if (SrcLayout.ImmutableSamplers != nullptr)
        {
            ImmutableSamplerDesc* const ImmutableSamplers = MemPool.ConstructArray<ImmutableSamplerDesc>(SrcLayout.NumImmutableSamplers);
            DstLayout.ImmutableSamplers                   = ImmutableSamplers;
            for (Uint32 i = 0; i < SrcLayout.NumImmutableSamplers; ++i)
            {
                const ImmutableSamplerDesc& SrcSmplr = SrcLayout.ImmutableSamplers[i];
#ifdef DILIGENT_DEVELOPMENT
                {
                    const Float32* BorderColor = SrcSmplr.Desc.BorderColor;
                    if (!((BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 0) ||
                          (BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 1) ||
                          (BorderColor[0] == 1 && BorderColor[1] == 1 && BorderColor[2] == 1 && BorderColor[3] == 1)))
                    {
                        LOG_WARNING_MESSAGE("Immutable sampler for variable \"", SrcSmplr.SamplerOrTextureName, "\" specifies border color (",
                                            BorderColor[0], ", ", BorderColor[1], ", ", BorderColor[2], ", ", BorderColor[3],
                                            "). D3D12 static samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors");
                    }
                }
#endif

                ImmutableSamplers[i]                      = SrcSmplr;
                ImmutableSamplers[i].SamplerOrTextureName = MemPool.CopyString(SrcSmplr.SamplerOrTextureName);
            }
        }
    }